

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
cs::method_foreach::preprocess
          (method_foreach *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  element_type *peVar2;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  internal_error *this_00;
  compile_error *this_01;
  string local_38;
  
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar4;
  local_38._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_38);
  if (*pptVar5 == (token_base *)0x0) {
    this_00 = (internal_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Null pointer accessed.","")
    ;
    internal_error::internal_error(this_00,&local_38);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_38._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_38);
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 4) {
    peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_38);
    domain_manager::add_record(&(peVar2->super_runtime_type).storage,(string *)(*pptVar5 + 3));
    return;
  }
  this_01 = (compile_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Wrong grammar in foreach statement, expect <id>","");
  compile_error::compile_error(this_01,&local_38);
  __cxa_throw(this_01,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void method_foreach::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar in foreach statement, expect <id>");
		context->instance->storage.add_record(static_cast<token_id *>(t.root().data())->get_id());
	}